

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

void fnode_service_notify_state(fnode_service_t *svc,char *state,uint32_t size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  timeval tv;
  timeval local_440 [65];
  
  if (svc != (fnode_service_t *)0x0) {
    gettimeofday(local_440,(__timezone_ptr_t)0x0);
    lVar2 = CONCAT44(local_440[0].tv_sec._4_4_,(undefined4)local_440[0].tv_sec);
    lVar3 = CONCAT44(local_440[0].tv_usec._4_4_,(undefined4)local_440[0].tv_usec);
    memset(local_440,0,0x40c);
    local_440[0].tv_sec._0_4_ = 0x41544144;
    local_440[0].tv_sec._4_4_ = (undefined4)*(undefined8 *)svc->sn;
    local_440[0].tv_usec._0_4_ = (undefined4)((ulong)*(undefined8 *)svc->sn >> 0x20);
    uVar1 = 0x400;
    if (size < 0x400) {
      uVar1 = size;
    }
    memcpy((void *)((long)&local_440[0].tv_usec + 4),state,(ulong)uVar1);
    _Var4 = fnet_socket_sendto(svc->socket,(char *)local_440,0x40c,&svc->server);
    if (_Var4) {
      svc->last_cmd_time = lVar2 * 1000 + lVar3 / 1000;
    }
  }
  return;
}

Assistant:

void fnode_service_notify_state(fnode_service_t *svc, char const state[FMAX_DATA_LENGTH], uint32_t size)
{
    if (svc)
    {
        size_t time_now = fnode_service_time();

        fcmd_node_status cmd = {{ FCMD_CHARS(FCMD_DATA) }};
        memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
        memcpy(cmd.data,     state,         size > FMAX_DATA_LENGTH ? FMAX_DATA_LENGTH : size);

        if (fnet_socket_sendto(svc->socket, (const char *)&cmd, sizeof cmd, &svc->server))
            svc->last_cmd_time = time_now;
    }
}